

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.cpp
# Opt level: O1

int __thiscall
jrtplib::RTPInternalSourceData::ProcessSDESItem
          (RTPInternalSourceData *this,uint8_t sdesid,uint8_t *data,size_t itemlen,
          RTPTime *receivetime,bool *cnamecollis)

{
  int iVar1;
  size_t *psVar2;
  SDESItem *pSVar3;
  undefined7 in_register_00000031;
  uint8_t **ppuVar4;
  size_t sVar5;
  
  *cnamecollis = false;
  (this->super_RTPSourceData).stats.lastmsgtime.m_t = receivetime->m_t;
  iVar1 = 0x133e80;
  switch((int)CONCAT71(in_register_00000031,sdesid)) {
  case 1:
    sVar5 = (this->super_RTPSourceData).SDESinf.nonprivateitems[0].length;
    if (sVar5 == 0) {
      if (itemlen < 0x100) {
        RTCPSDESInfo::SDESItem::SetString
                  ((this->super_RTPSourceData).SDESinf.nonprivateitems,
                   &(this->super_RTPSourceData).SDESinf.nonprivateitems[0].str,
                   &(this->super_RTPSourceData).SDESinf.nonprivateitems[0].length,data,itemlen);
      }
      cnamecollis = &(this->super_RTPSourceData).validated;
    }
    else if ((sVar5 == itemlen) &&
            (iVar1 = bcmp(data,(this->super_RTPSourceData).SDESinf.nonprivateitems[0].str,itemlen),
            iVar1 == 0)) goto switchD_0012e639_default;
    *cnamecollis = true;
    goto switchD_0012e639_default;
  case 2:
    sVar5 = (this->super_RTPSourceData).SDESinf.nonprivateitems[1].length;
    if ((sVar5 == 0) && (iVar1 = -0x37, itemlen < 0x100)) {
      psVar2 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[1].length;
      ppuVar4 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[1].str;
      pSVar3 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 1;
LAB_0012e767:
      iVar1 = RTCPSDESInfo::SDESItem::SetString(pSVar3,ppuVar4,psVar2,data,itemlen);
    }
    break;
  case 3:
    sVar5 = (this->super_RTPSourceData).SDESinf.nonprivateitems[2].length;
    if ((sVar5 == 0) && (iVar1 = -0x37, itemlen < 0x100)) {
      psVar2 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[2].length;
      ppuVar4 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[2].str;
      pSVar3 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 2;
      goto LAB_0012e767;
    }
    break;
  case 4:
    if (0xff < itemlen) {
      return -0x37;
    }
    pSVar3 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 3;
    ppuVar4 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[3].str;
    psVar2 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[3].length;
    goto LAB_0012e7a6;
  case 5:
    if (0xff < itemlen) {
      return -0x37;
    }
    pSVar3 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 4;
    ppuVar4 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[4].str;
    psVar2 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[4].length;
    goto LAB_0012e7a6;
  case 6:
    sVar5 = (this->super_RTPSourceData).SDESinf.nonprivateitems[5].length;
    if ((sVar5 == 0) && (iVar1 = -0x37, itemlen < 0x100)) {
      psVar2 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[5].length;
      ppuVar4 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[5].str;
      pSVar3 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 5;
      goto LAB_0012e767;
    }
    break;
  case 7:
    (this->super_RTPSourceData).stats.lastnotetime.m_t = receivetime->m_t;
    if (0xff < itemlen) {
      return -0x37;
    }
    pSVar3 = (this->super_RTPSourceData).SDESinf.nonprivateitems + 6;
    ppuVar4 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[6].str;
    psVar2 = &(this->super_RTPSourceData).SDESinf.nonprivateitems[6].length;
LAB_0012e7a6:
    iVar1 = RTCPSDESInfo::SDESItem::SetString(pSVar3,ppuVar4,psVar2,data,itemlen);
    return iVar1;
  default:
    goto switchD_0012e639_default;
  }
  if (sVar5 != 0) {
switchD_0012e639_default:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPInternalSourceData::ProcessSDESItem(uint8_t sdesid,const uint8_t *data,size_t itemlen,const RTPTime &receivetime,bool *cnamecollis)
{
	*cnamecollis = false;
	
	stats.SetLastMessageTime(receivetime);
	
	switch(sdesid)
	{
	case RTCP_SDES_ID_CNAME:
		{
			size_t curlen;
			uint8_t *oldcname;
			
			// NOTE: we're going to make sure that the CNAME is only set once.
			oldcname = SDESinf.GetCNAME(&curlen);
			if (curlen == 0)
			{
				// if CNAME is set, the source is validated
				SDESinf.SetCNAME(data,itemlen);
				validated = true;
			}
			else // check if this CNAME is equal to the one that is already present
			{
				if (curlen != itemlen)
					*cnamecollis = true;
				else
				{
					if (memcmp(data,oldcname,itemlen) != 0)
						*cnamecollis = true;
				}
			}
		}
		break;
	case RTCP_SDES_ID_NAME:
		{
			size_t oldlen;

            		SDESinf.GetName(&oldlen);
			if (oldlen == 0) // Name not set
				return SDESinf.SetName(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_EMAIL:
		{
			size_t oldlen;

			SDESinf.GetEMail(&oldlen);
			if (oldlen == 0)
				return SDESinf.SetEMail(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_PHONE:
		return SDESinf.SetPhone(data,itemlen);
	case RTCP_SDES_ID_LOCATION:
		return SDESinf.SetLocation(data,itemlen);
	case RTCP_SDES_ID_TOOL:
		{
			size_t oldlen;

			SDESinf.GetTool(&oldlen);
			if (oldlen == 0)
				return SDESinf.SetTool(data,itemlen);
		}
		break;
	case RTCP_SDES_ID_NOTE:
		stats.SetLastNoteTime(receivetime);
		return SDESinf.SetNote(data,itemlen);
	}
	return 0;
}